

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::SampledFunc::~SampledFunc(SampledFunc *this)

{
  SampledFunc *this_local;
  
  ~SampledFunc(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

SampledFunc() : SystemSubroutine("$sampled", SubroutineKind::Function) {}